

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6246d::TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat::
~TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat
          (TestXmlTestReporterFixtureSingleFailedTestReportSummaryFormat *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, SingleFailedTestReportSummaryFormat)
{
    TestDetails const details("A Test", "suite", "A File", 4321);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "A Failure");
    reporter.ReportSummary(1, 1, 1, 0.1f);

    const char *expected =
        "<?xml version=\"1.0\"?>"
        "<unittest-results tests=\"1\" failedtests=\"1\" failures=\"1\" time=\"0.1\">"
        "<test suite=\"suite\" name=\"A Test\" time=\"0\">"
        "<failure message=\"A File(4321) : A Failure\"/>"
        "</test>"
        "</unittest-results>";

    CHECK_EQUAL(expected, output.str());
}